

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-poll-oob.c
# Opt level: O0

void poll_cb(uv_fs_t *req)

{
  uv_handle_t *handle_00;
  int iVar1;
  long *plVar2;
  uv_stat_t *b;
  ulong uVar3;
  uint64_t uVar4;
  uv_fs_poll_t *handle;
  uint64_t interval;
  poll_ctx *ctx;
  uv_stat_t *statbuf;
  uv_fs_t *req_local;
  
  plVar2 = &req[-1].statbuf.st_ctim.tv_nsec;
  handle_00 = (uv_handle_t *)*plVar2;
  iVar1 = uv_is_active(handle_00);
  if ((iVar1 != 0) && ((handle_00->flags & 3) == 0)) {
    if (req->result == 0) {
      b = &req->statbuf;
      if (((int)req[-1].statbuf.st_birthtim.tv_sec != 0) &&
         (((int)req[-1].statbuf.st_birthtim.tv_sec < 0 ||
          (iVar1 = statbuf_eq((uv_stat_t *)(req + 1),b), iVar1 == 0)))) {
        (**(code **)&req[-1].file)(*plVar2,0,req + 1,b);
      }
      memcpy(req + 1,b,0xa0);
      *(undefined4 *)&req[-1].statbuf.st_birthtim.tv_sec = 1;
    }
    else if ((long)(int)req[-1].statbuf.st_birthtim.tv_sec != req->result) {
      (**(code **)&req[-1].file)(*plVar2,req->result & 0xffffffff,req + 1,&zero_statbuf);
      *(int *)&req[-1].statbuf.st_birthtim.tv_sec = (int)req->result;
    }
  }
  uv_fs_req_cleanup(req);
  iVar1 = uv_is_active(handle_00);
  if ((iVar1 == 0) || ((handle_00->flags & 3) != 0)) {
    uv_close((uv_handle_t *)&req[-1].mode,timer_close_cb);
  }
  else {
    uVar3 = (ulong)*(uint *)((long)&req[-1].statbuf.st_birthtim.tv_sec + 4);
    uVar4 = uv_now((uv_loop_t *)req[-1].new_path);
    iVar1 = uv_timer_start((uv_timer_t *)&req[-1].mode,timer_cb,
                           uVar3 - (uVar4 - req[-1].statbuf.st_birthtim.tv_nsec) % uVar3,0);
    if (iVar1 != 0) {
      abort();
    }
  }
  return;
}

Assistant:

static void poll_cb(uv_poll_t* handle, int status, int events) {
  char buffer[5];
  int n;
  int fd;

  ASSERT(0 == uv_fileno((uv_handle_t*)handle, &fd));
  memset(buffer, 0, 5);

  if (events & UV_PRIORITIZED) {
    do
      n = recv(client_fd, &buffer, 5, MSG_OOB);
    while (n == -1 && errno == EINTR);
    ASSERT(n >= 0 || errno != EINVAL);
    cli_pr_check = 1;
    ASSERT(0 == uv_poll_stop(&poll_req[0]));
    ASSERT(0 == uv_poll_start(&poll_req[0],
                              UV_READABLE | UV_WRITABLE,
                              poll_cb));
  }
  if (events & UV_READABLE) {
    if (fd == client_fd) {
      do
        n = recv(client_fd, &buffer, 5, 0);
      while (n == -1 && errno == EINTR);
      ASSERT(n >= 0 || errno != EINVAL);
      if (cli_rd_check == 1) {
        ASSERT(strncmp(buffer, "world", n) == 0);
        ASSERT(5 == n);
        cli_rd_check = 2;
      }
      if (cli_rd_check == 0) {
        ASSERT(n == 4);
        ASSERT(strncmp(buffer, "hello", n) == 0);
        cli_rd_check = 1;
        do {
          do
            n = recv(server_fd, &buffer, 5, 0);
          while (n == -1 && errno == EINTR);
          if (n > 0) {
            ASSERT(n == 5);
            ASSERT(strncmp(buffer, "world", n) == 0);
            cli_rd_check = 2;
          }
        } while (n > 0);

        ASSERT(got_eagain());
      }
    }
    if (fd == server_fd) {
      do
        n = recv(server_fd, &buffer, 3, 0);
      while (n == -1 && errno == EINTR);
      ASSERT(n >= 0 || errno != EINVAL);
      ASSERT(3 == n);
      ASSERT(strncmp(buffer, "foo", n) == 0);
      srv_rd_check = 1;
      uv_poll_stop(&poll_req[1]);
    }
  }
  if (events & UV_WRITABLE) {
    do {
      n = send(client_fd, "foo", 3, 0);
    } while (n < 0 && errno == EINTR);
    ASSERT(3 == n);
  }
}